

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Version.cpp
# Opt level: O2

string * llbuild::getLLBuildFullVersion_abi_cxx11_(StringRef productName)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  StringRef local_40;
  string local_30;
  
  llvm::StringRef::str_abi_cxx11_(&local_30,&local_40);
  std::operator+(in_RDI,&local_30," version 5.2");
  std::__cxx11::string::_M_dispose();
  return in_RDI;
}

Assistant:

std::string getLLBuildFullVersion(StringRef productName) {
  std::string result = productName.str() + " version 5.2";

  // Include the additional build version information, if present.
#ifdef LLBUILD_VENDOR_STRING
  result = std::string(LLBUILD_VENDOR_STRING) + " " + result;
#endif
#ifdef LLBUILD_VERSION_STRING
  result = result + " (" + std::string(LLBUILD_VERSION_STRING) + ")";
#endif

  return result;
}